

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_def.c
# Opt level: O0

int free_field(FIELD *field)

{
  int *piVar1;
  FIELD *local_20;
  FIELD *f;
  FIELD *field_local;
  
  if (field == (FIELD *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
    field_local._4_4_ = -2;
  }
  else if (field->form == (formnode *)0x0) {
    local_20 = field;
    if (field == field->link) {
      if (field->buf != (char *)0x0) {
        free(field->buf);
      }
    }
    else {
      for (; local_20->link != field; local_20 = local_20->link) {
      }
      local_20->link = field->link;
    }
    _nc_Free_Type(field);
    free(field);
    piVar1 = __errno_location();
    *piVar1 = 0;
    field_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = -4;
    field_local._4_4_ = -4;
  }
  return field_local._4_4_;
}

Assistant:

int free_field(FIELD * field)
{
  if (!field) 
    RETURN(E_BAD_ARGUMENT);

  if (field->form)
    RETURN(E_CONNECTED);
  
  if (field == field->link)
    {
      if (field->buf) 
	free(field->buf);
    }
  else 
    {
      FIELD *f;

      for(f=field;f->link != field;f = f->link) 
	{}
      f->link = field->link;
    }
  _nc_Free_Type(field);
  free(field);
  RETURN(E_OK);
}